

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
          (QMovableArrayOps<QCss::Value> *this,qsizetype i,Value *args)

{
  Value **ppVVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  Value *pVVar5;
  qsizetype qVar6;
  long in_FS_OFFSET;
  bool bVar7;
  Inserter local_80;
  Value tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.size == i)
    {
      qVar6 = QArrayDataPointer<QCss::Value>::freeSpaceAtEnd((QArrayDataPointer<QCss::Value> *)this)
      ;
      if (qVar6 == 0) goto LAB_0049de29;
      QCss::Value::Value((this->super_QGenericArrayOps<QCss::Value>).
                         super_QArrayDataPointer<QCss::Value>.ptr +
                         (this->super_QGenericArrayOps<QCss::Value>).
                         super_QArrayDataPointer<QCss::Value>.size,args);
LAB_0049df66:
      pqVar2 = &(this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.
                size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0049df25;
    }
LAB_0049de29:
    if (i == 0) {
      qVar6 = QArrayDataPointer<QCss::Value>::freeSpaceAtBegin
                        ((QArrayDataPointer<QCss::Value> *)this);
      if (qVar6 != 0) {
        QCss::Value::Value((this->super_QGenericArrayOps<QCss::Value>).
                           super_QArrayDataPointer<QCss::Value>.ptr + -1,args);
        ppVVar1 = &(this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.
                   ptr;
        *ppVVar1 = *ppVVar1 + -1;
        goto LAB_0049df66;
      }
    }
  }
  tmp.variant.d._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.variant.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.variant.d.data._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.variant.d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  QCss::Value::Value(&tmp,args);
  bVar7 = (this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.size != 0
  ;
  QArrayDataPointer<QCss::Value>::detachAndGrow
            ((QArrayDataPointer<QCss::Value> *)this,(uint)(i == 0 && bVar7),1,(Value **)0x0,
             (QArrayDataPointer<QCss::Value> *)0x0);
  if (i == 0 && bVar7) {
    pVVar5 = (this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.ptr;
    pVVar5[-1].type = tmp.type;
    *(undefined8 *)((long)&pVVar5[-1].variant.d.data + 0x10) = tmp.variant.d.data._16_8_;
    *(undefined8 *)&pVVar5[-1].variant.d.field_0x18 = tmp.variant.d._24_8_;
    pVVar5[-1].variant.d.data.shared = tmp.variant.d.data.shared;
    *(undefined8 *)((long)&pVVar5[-1].variant.d.data + 8) = tmp.variant.d.data._8_8_;
    tmp.variant.d.data.shared = (PrivateShared *)0x0;
    tmp.variant.d.data._8_8_ = 0;
    tmp.variant.d.data._16_8_ = 0;
    tmp.variant.d._24_8_ = 2;
    ppVVar1 = &(this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.ptr;
    *ppVVar1 = *ppVVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QCss::Value> *)this,i,1);
    (local_80.displaceFrom)->type = tmp.type;
    *(undefined8 *)((long)&((local_80.displaceFrom)->variant).d.data + 0x10) =
         tmp.variant.d.data._16_8_;
    *(undefined8 *)&((local_80.displaceFrom)->variant).d.field_0x18 = tmp.variant.d._24_8_;
    ((local_80.displaceFrom)->variant).d.data.shared = tmp.variant.d.data.shared;
    *(undefined8 *)((long)&((local_80.displaceFrom)->variant).d.data + 8) = tmp.variant.d.data._8_8_
    ;
    tmp.variant.d.data.shared = (PrivateShared *)0x0;
    tmp.variant.d.data._8_8_ = 0;
    tmp.variant.d.data._16_8_ = 0;
    tmp.variant.d._24_8_ = 2;
    local_80.displaceFrom = local_80.displaceFrom + 1;
    Inserter::~Inserter(&local_80);
  }
  ::QVariant::~QVariant(&tmp.variant);
LAB_0049df25:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }